

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::cropImage<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *__return_storage_ptr__,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long x,long y,long w,
          long h)

{
  work_t wVar1;
  size_t h_00;
  long i;
  size_t sVar2;
  int d;
  long lVar3;
  long k;
  size_t sVar4;
  
  if (w < 1) {
    w = 0;
  }
  h_00 = 0;
  if (0 < h) {
    h_00 = h;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            (__return_storage_ptr__,w,h_00,image->depth);
  if ((((y | x) < 0) || (image->width < w + x)) || (image->height < (long)(y + h_00))) {
    for (lVar3 = 0; lVar3 < image->depth; lVar3 = lVar3 + 1) {
      for (sVar4 = 0; sVar4 != h_00; sVar4 = sVar4 + 1) {
        for (sVar2 = 0; w != sVar2; sVar2 = sVar2 + 1) {
          wVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBoundsInv
                            (image,sVar2 + x,sVar4 + y,(int)lVar3);
          __return_storage_ptr__->img[lVar3][sVar4][sVar2] = (uchar)wVar1;
        }
      }
    }
  }
  else {
    for (lVar3 = 0; lVar3 < image->depth; lVar3 = lVar3 + 1) {
      for (sVar4 = 0; h_00 != sVar4; sVar4 = sVar4 + 1) {
        memcpy(__return_storage_ptr__->img[lVar3][sVar4],image->img[lVar3][y + sVar4] + x,w);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}